

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void * SensorChangeHandler(void *service)

{
  int iVar1;
  string *psVar2;
  string *in_RDI;
  fnode_service_t *unaff_retaddr;
  string *unconfirmedState;
  
  do {
    do {
      while( true ) {
        getBtnsState_abi_cxx11_();
        iVar1 = std::__cxx11::string::compare((string *)&BtnState_abi_cxx11_);
        if (iVar1 != 0) break;
        usleep(1);
      }
      usleep(20000);
      getBtnsState_abi_cxx11_();
      iVar1 = std::__cxx11::string::compare((string *)&BtnState_abi_cxx11_);
    } while (iVar1 == 0);
    psVar2 = (string *)std::__cxx11::string::length();
    std::__cxx11::string::replace(0x10c470,0,psVar2);
    sendBtnsState(unaff_retaddr,in_RDI);
  } while( true );
}

Assistant:

void* SensorChangeHandler(void* service)
{
	for(;;)
	{
		while(BtnState.compare(getBtnsState()) == 0)
		{
			usleep(1);
		}
		
		usleep(20000);
		const string& unconfirmedState = getBtnsState();
		if(BtnState.compare(unconfirmedState) != 0)
		{
			BtnState.replace(0, unconfirmedState.length(), unconfirmedState);			
			sendBtnsState((fnode_service_t *)service, BtnState);
		}  
	}    
}